

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.hpp
# Opt level: O1

unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_> __thiscall
TasGrid::GridReaderVersion5<TasGrid::GridSequence>::read<TasGrid::IO::mode_binary_type>
          (GridReaderVersion5<TasGrid::GridSequence> *this,AccelerationContext *acc,istream *is)

{
  GridSequence *this_00;
  TypeOneDRule TVar1;
  undefined8 *puVar2;
  unsigned_long num_entries;
  pointer *__ptr;
  size_t sVar3;
  size_t sVar4;
  int v;
  MultiIndexSet local_70;
  vector<double,_std::allocator<double>_> local_48;
  
  puVar2 = (undefined8 *)operator_new(0x120);
  puVar2[1] = acc;
  puVar2[2] = 0;
  puVar2[3] = 0;
  *(undefined4 *)(puVar2 + 4) = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  *(undefined4 *)(puVar2 + 9) = 0;
  puVar2[10] = 0;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  puVar2[0xd] = 0;
  puVar2[0xe] = 0;
  puVar2[0xf] = 0;
  puVar2[0x10] = 0;
  puVar2[0x11] = 0;
  *puVar2 = &PTR__GridSequence_001f67c0;
  *(undefined4 *)(puVar2 + 0x12) = 0;
  memset(puVar2 + 0x13,0,0x88);
  *(undefined8 **)this = puVar2;
  ::std::istream::read((char *)is,(long)&local_70);
  num_entries = local_70.num_dimensions & 0xffffffff;
  *(undefined4 *)(puVar2 + 2) = (undefined4)local_70.num_dimensions;
  ::std::istream::read((char *)is,(long)&local_70);
  *(undefined4 *)((long)puVar2 + 0x14) = (undefined4)local_70.num_dimensions;
  TVar1 = IO::readRule<TasGrid::IO::mode_binary_type>(is);
  *(TypeOneDRule *)(puVar2 + 0x12) = TVar1;
  ::std::istream::read((char *)is,(long)&local_70);
  if ((char)local_70.num_dimensions == 'y') {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>(&local_70,is);
    *(int *)(puVar2 + 4) = local_70.cache_num_indexes;
    puVar2[3] = local_70.num_dimensions;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(puVar2 + 5),&local_70.indexes);
    if ((pointer)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  ::std::istream::read((char *)is,(long)&local_70);
  if ((char)local_70.num_dimensions == 'y') {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>(&local_70,is);
    *(int *)(puVar2 + 9) = local_70.cache_num_indexes;
    puVar2[8] = local_70.num_dimensions;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(puVar2 + 10),&local_70.indexes);
    if ((pointer)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  ::std::istream::read((char *)is,(long)&local_70);
  if ((char)local_70.num_dimensions == 'y') {
    sVar4 = (size_t)*(int *)((long)puVar2 + 0x14);
    sVar3 = (size_t)*(int *)(puVar2 + 4);
    IO::readVector<TasGrid::IO::mode_binary_type,double,unsigned_long>
              (&local_48,(IO *)is,(istream *)(sVar3 * sVar4),num_entries);
    local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
    local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    puVar2[0x13] = sVar4;
    puVar2[0x14] = sVar3;
    local_70.num_dimensions = sVar4;
    local_70._8_8_ = sVar3;
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)(puVar2 + 0x15),
               (vector<double,_std::allocator<double>_> *)&local_70.indexes);
    if ((pointer)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  this_00 = *(GridSequence **)this;
  if (0 < (this_00->super_BaseCanonicalGrid).num_outputs) {
    StorageSet::StorageSet<TasGrid::IO::mode_binary_type>((StorageSet *)&local_70,is);
    (this_00->super_BaseCanonicalGrid).values.num_outputs = local_70.num_dimensions;
    (this_00->super_BaseCanonicalGrid).values.num_values = local_70._8_8_;
    ::std::vector<double,_std::allocator<double>_>::operator=
              (&(this_00->super_BaseCanonicalGrid).values.values,
               (vector<double,_std::allocator<double>_> *)&local_70.indexes);
    if ((pointer)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  GridSequence::prepareSequence(this_00,0);
  return (__uniq_ptr_data<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<GridSequence> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridSequence> grid = Utils::make_unique<GridSequence>(acc);

        grid->num_dimensions = IO::readNumber<iomode, int>(is);
        grid->num_outputs = IO::readNumber<iomode, int>(is);
        grid->rule = IO::readRule<iomode>(is);

        if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
        if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());

        if (IO::readFlag<iomode>(is))
            grid->surpluses = IO::readData2D<iomode, double>(is, grid->num_outputs, grid->points.getNumIndexes());

        if (grid->num_outputs > 0) grid->values = StorageSet(is, iomode());

        grid->prepareSequence(0);

        return grid;
    }